

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O3

void create_line_undo_proc(Am_Object *cmd)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  ushort uVar6;
  Am_Object line;
  Am_Object o2;
  Am_Value has_been_undone;
  Am_Object AStack_28;
  Am_Object local_20;
  Am_Value local_18;
  
  uVar6 = (ushort)cmd;
  pAVar4 = (Am_Value *)Am_Object::Get(uVar6,0x16d);
  Am_Object::Am_Object(&AStack_28,pAVar4);
  local_18.type = 0;
  local_18.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar4 = (Am_Value *)Am_Object::Get(uVar6,0x16f);
  Am_Value::operator=(&local_18,pAVar4);
  bVar1 = Am_Value::Valid();
  Am_Object::Set(uVar6,true,(ulong)(bVar1 ^ 1));
  cVar2 = Am_Object::Valid();
  if (cVar2 != '\0') {
    local_20.data = (Am_Object_Data *)0x0;
    cVar2 = Am_Value::Valid();
    uVar6 = (ushort)&AStack_28;
    if (cVar2 == '\0') {
      pAVar4 = (Am_Value *)Am_Object::Get(uVar6,(ulong)INPUT_1);
      Am_Object::operator=(&local_20,pAVar4);
      clean_other_for_line(&local_20,&AStack_28,INPUT_WAS);
      pAVar4 = (Am_Value *)Am_Object::Get(uVar6,(ulong)OUTPUT_1);
      Am_Object::operator=(&local_20,pAVar4);
      clean_other_for_line(&local_20,&AStack_28,OUTPUT_WAS);
    }
    else {
      pAVar4 = (Am_Value *)Am_Object::Get(uVar6,(ulong)OUTPUT_1);
      Am_Object::operator=(&local_20,pAVar4);
      pAVar4 = (Am_Value *)Am_Object::Get(uVar6,(ulong)OUTPUT_WAS);
      uVar3 = Am_Value::operator_cast_to_int(pAVar4);
      pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&AStack_28);
      Am_Object::Set((ushort)&local_20,(Am_Wrapper *)(ulong)(uVar3 & 0xffff),(ulong)pAVar5);
      pAVar4 = (Am_Value *)Am_Object::Get(uVar6,(ulong)INPUT_1);
      Am_Object::operator=(&local_20,pAVar4);
      line_for_list(&local_20,&AStack_28,false);
    }
    Am_Object::~Am_Object(&local_20);
  }
  Am_Value::~Am_Value(&local_18);
  Am_Object::~Am_Object(&AStack_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, create_line_undo,
		 (Am_Object cmd)) {
  Am_Object line = cmd.Get(Am_OBJECT_MODIFIED);
  Am_Value has_been_undone;
  has_been_undone = cmd.Peek(Am_HAS_BEEN_UNDONE);
  cmd.Set(Am_HAS_BEEN_UNDONE, !has_been_undone.Valid());
  if (line.Valid()) {
    // cout << " for line " << line << " cmd " << cmd
    //  << " has_been_undone " << has_been_undone << endl << flush;
    Am_Object o2;
    if (has_been_undone.Valid()) { //becoming visible
      o2 = line.Get(OUTPUT_1);
      int where_in_o2 = (int)line.Get(OUTPUT_WAS);
      o2.Set(where_in_o2, line);
      o2 = line.Get(INPUT_1);
      line_for_list(o2, line, false);
    }
    else { //make it invisible
      o2 = line.Get(INPUT_1);
      clean_other_for_line(o2, line, INPUT_WAS);
      o2 = line.Get(OUTPUT_1);
      clean_other_for_line(o2, line, OUTPUT_WAS);
    }
  }
}